

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O2

string * __thiscall
duckdb::Binding::GetAlias_abi_cxx11_(string *__return_storage_ptr__,Binding *this)

{
  string *psVar1;
  
  psVar1 = BindingAlias::GetAlias_abi_cxx11_(&this->alias);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

string Binding::GetAlias() const {
	return alias.GetAlias();
}